

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O2

void testParse(char *cmdLine,char **refArgs,int numArgs)

{
  deBool dVar1;
  deCommandLine *cmdLine_00;
  ulong uVar2;
  ulong uVar3;
  
  cmdLine_00 = deCommandLine_parse(cmdLine);
  if (cmdLine_00 == (deCommandLine *)0x0) {
    deAssertFail("parsedCmdLine",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                 ,0x97);
  }
  if (cmdLine_00->numArgs != numArgs) {
    deAssertFail("parsedCmdLine->numArgs == numArgs",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                 ,0x98);
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)numArgs;
  if (numArgs < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = deStringEqual(cmdLine_00->args[uVar3],refArgs[uVar3]);
    if (dVar1 == 0) {
      deAssertFail("deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                   ,0x9b);
    }
  }
  deCommandLine_destroy(cmdLine_00);
  return;
}

Assistant:

static void testParse (const char* cmdLine, const char* const* refArgs, int numArgs)
{
	deCommandLine*	parsedCmdLine	= deCommandLine_parse(cmdLine);
	int				argNdx;

	DE_TEST_ASSERT(parsedCmdLine);
	DE_TEST_ASSERT(parsedCmdLine->numArgs == numArgs);

	for (argNdx = 0; argNdx < numArgs; argNdx++)
		DE_TEST_ASSERT(deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx]));

	deCommandLine_destroy(parsedCmdLine);
}